

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall
rw::ColorQuant::matchImage(ColorQuant *this,uint8 *dstPixels,uint32 dstStride,Image *img)

{
  Node *pNVar1;
  uint uVar2;
  int iVar3;
  Node *pNVar4;
  byte *in;
  uint8 *d;
  uint8 *puVar5;
  byte *in_00;
  int iVar6;
  uint8 rgba [4];
  RGBA local_50;
  int local_4c;
  ulong local_48;
  byte *local_40;
  uint8 *local_38;
  
  iVar6 = img->height;
  if (0 < iVar6) {
    local_40 = img->pixels;
    local_48 = (ulong)dstStride;
    iVar3 = img->width;
    local_4c = 0;
    local_38 = dstPixels;
    do {
      if (0 < iVar3) {
        iVar6 = 0;
        puVar5 = local_38;
        in_00 = local_40;
        do {
          switch(img->depth << 0x1e | img->depth - 4U >> 2) {
          case 0:
          case 1:
            in = img->palette + (ulong)*in_00 * 4;
            goto LAB_0010ef05;
          case 3:
            conv_RGBA8888_from_ARGB1555(&local_50.red,in_00);
            break;
          case 5:
            conv_RGBA8888_from_RGB888(&local_50.red,in_00);
            break;
          case 7:
            in = in_00;
LAB_0010ef05:
            conv_RGBA8888_from_RGBA8888(&local_50.red,in);
          }
          uVar2 = makeTreeAddr(local_50);
          iVar3 = -8;
          pNVar4 = this->root;
          do {
            pNVar1 = pNVar4->children[uVar2 & 0xf];
            if (pNVar1 == (Node *)0x0) break;
            uVar2 = uVar2 >> 4;
            iVar3 = iVar3 + 1;
            pNVar4 = pNVar1;
          } while (iVar3 != 0);
          *puVar5 = (uint8)pNVar4->numPixels;
          in_00 = in_00 + img->bpp;
          puVar5 = puVar5 + 1;
          iVar6 = iVar6 + 1;
          iVar3 = img->width;
        } while (iVar6 < iVar3);
        iVar6 = img->height;
      }
      local_40 = local_40 + img->stride;
      local_38 = local_38 + local_48;
      local_4c = local_4c + 1;
    } while (local_4c < iVar6);
  }
  return;
}

Assistant:

void
ColorQuant::matchImage(uint8 *dstPixels, uint32 dstStride, Image *img)
{
	RGBA col;
	uint8 rgba[4];
	uint8 *pixels = img->pixels;
	for(int y = 0; y < img->height; y++){
		uint8 *line = pixels;
		uint8 *dline = dstPixels;
		for(int x = 0; x < img->width; x++){
			uint8 *p = line;
			uint8 *d = dline;
			switch(img->depth){
			case 4: case 8:
				conv_RGBA8888_from_RGBA8888(rgba, &img->palette[p[0]*4]);
				break;
			case 32:
				conv_RGBA8888_from_RGBA8888(rgba, p);
				break;
			case 24:
				conv_RGBA8888_from_RGB888(rgba, p);
				break;
			case 16:
				conv_RGBA8888_from_ARGB1555(rgba, p);
				break;
			default: assert(0 && "invalid depth");
			}
			
			col.red = rgba[0];
			col.green = rgba[1];
			col.blue = rgba[2];
			col.alpha = rgba[3];
			*d = this->findColor(col);

			line += img->bpp;
			dline++;
		}
		pixels += img->stride;
		dstPixels += dstStride;
	}
}